

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiQuery.cpp
# Opt level: O3

void __thiscall
MultiQuery<dto::Simple,_dto::Simple>::on_input(MultiQuery<dto::Simple,_dto::Simple> *this,Poll *p)

{
  ssize_t sVar1;
  ostream *poVar2;
  char *__s;
  size_t sVar3;
  Error *this_00;
  socklen_t remln;
  Simple dto;
  string data;
  socklen_t local_bc;
  undefined1 local_b8 [24];
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  string local_78;
  undefined1 local_58 [16];
  undefined2 local_48;
  _Alloc_hider local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_bc = 0x10;
  sVar1 = recvfrom((this->super_Subscriber).fd,buffer_abi_cxx11_._M_dataplus._M_p,
                   buffer_abi_cxx11_._M_string_length,0,(sockaddr *)&this->remote,&local_bc);
  if (-1 < (int)sVar1) {
    std::__cxx11::string::substr((ulong)&local_78,0x14c530);
    local_b8[0] = '\0';
    local_b8[1] = '\0';
    local_b8[2] = '\0';
    local_b8[3] = '\0';
    local_b8[4] = '\0';
    local_b8[5] = '\0';
    local_b8[6] = '\0';
    local_b8[7] = '\0';
    local_b8[8] = '\0';
    local_b8[9] = '\0';
    local_b8._10_6_ = 0;
    local_b8._16_2_ = 0;
    local_98 = 0;
    local_90._M_local_buf[0] = '\0';
    local_a0._M_p = (pointer)&local_90;
    ::dto::unmarshall_facade<dto::Simple>((Simple *)local_58,&local_78);
    local_b8._16_2_ = local_48;
    local_b8._0_8_ = local_58._0_8_;
    local_b8._8_2_ = (undefined2)local_58._8_8_;
    local_b8._10_6_ = SUB86(local_58._8_8_,2);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_p != &local_30) {
      operator_delete(local_40._M_p,local_30._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"MultiQuery: received ",0x15);
    poVar2 = operator<<((ostream *)&std::cout,(Simple *)local_b8);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (CONCAT26(local_b8._16_2_,local_b8._10_6_) == (this->req).header.cmd_seq) {
      if ((this->callback).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_58._0_2_ = (this->remote).sin_family;
        local_58._2_2_ = (this->remote).sin_port;
        local_58._4_4_ = (this->remote).sin_addr.s_addr;
        local_58._8_8_ = *(undefined8 *)(this->remote).sin_zero;
        (*(this->callback)._M_invoker)
                  ((_Any_data *)&this->callback,(Simple *)local_b8,(sockaddr_in *)local_58);
      }
    }
    else {
      __s = inet_ntoa((in_addr)(this->remote).sin_addr.s_addr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[PCKG ERROR] Skipping invalid package from ",0x2b);
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1523b8);
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,". ",2);
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_p != &local_90) {
      operator_delete(local_a0._M_p,
                      CONCAT71(local_90._M_allocated_capacity._1_7_,local_90._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"Invalid read udp packet");
  __cxa_throw(this_00,&Error::typeinfo,std::exception::~exception);
}

Assistant:

void MultiQuery<REQ, RES>::on_input(Poll &p) {
  socklen_t remln = sizeof(remote);
  int read = recvfrom(fd, &buffer[0], buffer.size(), 0, (struct sockaddr *) &remote, &remln);
  if (read < 0) {
    throw Error("Invalid read udp packet");
  }
  std::string data = buffer.substr(0, read);
  RES dto;
  try {
    dto = dto::unmarshall_facade<RES>(data);
  } catch (Error &e) {
    if (this->error)
      this->error();
    return;
  }
  std::cout << "MultiQuery: received " << dto << std::endl;
  if (dto.header.cmd_seq != this->req.header.cmd_seq) {
    char *s = inet_ntoa(remote.sin_addr);
    uint16_t port = ntohs(remote.sin_port);
    std::cout << "[PCKG ERROR] Skipping invalid package from " << s << ":" << port << ". " << std::endl;
  } else {
    if (this->callback)
      this->callback(dto, remote);
  }
}